

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::ShaderAtomicAddCase::getInputs
          (ShaderAtomicAddCase *this,int numValues,int stride,void *inputs)

{
  int max;
  deUint32 seed;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  Random rnd;
  
  seed = deStringHash((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
                      m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,seed);
  max = 0x20;
  if ((this->super_ShaderAtomicOpCase).m_precision == PRECISION_LOWP) {
    max = 2;
  }
  uVar3 = 0;
  uVar2 = (ulong)(uint)numValues;
  if (numValues < 1) {
    uVar2 = uVar3;
  }
  while (uVar2 != 0) {
    iVar1 = de::Random::getInt(&rnd,1,max);
    *(int *)((long)inputs + (long)(int)uVar3) = iVar1;
    uVar3 = (ulong)(uint)((int)uVar3 + stride);
    uVar2 = uVar2 - 1;
  }
  return;
}

Assistant:

void getInputs (int numValues, int stride, void* inputs) const
	{
		de::Random	rnd			(deStringHash(getName()));
		const int	maxVal		= m_precision == PRECISION_LOWP ? 2 : 32;
		const int	minVal		= 1;

		// \todo [2013-09-04 pyry] Negative values!

		for (int valNdx = 0; valNdx < numValues; valNdx++)
			*(int*)((deUint8*)inputs + stride*valNdx) = rnd.getInt(minVal, maxVal);
	}